

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

void __thiscall btSimpleDynamicsWorld::setGravity(btSimpleDynamicsWorld *this,btVector3 *gravity)

{
  int iVar1;
  btRigidBody *pbVar2;
  btRigidBody *in_RSI;
  long in_RDI;
  btRigidBody *body;
  btCollisionObject *colObj;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int n;
  
  *(_func_int ***)(in_RDI + 0xf4) = (in_RSI->super_btCollisionObject)._vptr_btCollisionObject;
  *(undefined8 *)(in_RDI + 0xfc) =
       *(undefined8 *)(in_RSI->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  iVar3 = 0;
  while( true ) {
    n = iVar3;
    iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                      ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8));
    if (iVar1 <= iVar3) break;
    btAlignedObjectArray<btCollisionObject_*>::operator[]
              ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),n);
    pbVar2 = btRigidBody::upcast((btCollisionObject *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
    if (pbVar2 != (btRigidBody *)0x0) {
      btRigidBody::setGravity(in_RSI,(btVector3 *)CONCAT44(n,in_stack_ffffffffffffffe8));
    }
    iVar3 = n + 1;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::setGravity(const btVector3& gravity)
{
	m_gravity = gravity;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			body->setGravity(gravity);
		}
	}
}